

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TraceConfig_DataSource::TraceConfig_DataSource
          (TraceConfig_DataSource *this,TraceConfig_DataSource *param_1)

{
  TraceConfig_DataSource *param_1_local;
  TraceConfig_DataSource *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_DataSource_009c1ab0;
  protozero::CopyablePtr<perfetto::protos::gen::DataSourceConfig>::CopyablePtr
            (&this->config_,&param_1->config_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->producer_name_filter_,&param_1->producer_name_filter_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->producer_name_regex_filter_,&param_1->producer_name_regex_filter_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TraceConfig_DataSource::TraceConfig_DataSource(const TraceConfig_DataSource&) = default;